

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O0

int sprkStep_TakeStep_Compensated(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  N_Vector p_Var1;
  N_Vector p_Var2;
  int iVar3;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  ARKodeMem in_RDI;
  sunrealtype ahati;
  sunrealtype ai;
  int retval;
  int is;
  sunrealtype chati;
  sunrealtype ci;
  N_Vector diff;
  N_Vector yn_plus_delta_Yi;
  N_Vector delta_Yi;
  ARKodeSPRKStepMem step_mem;
  ARKodeSPRKStepMem *in_stack_ffffffffffffff98;
  double dVar4;
  char *in_stack_ffffffffffffffa0;
  void *user_data;
  int iVar5;
  N_Vector ycur;
  double tcur;
  ARKodeSPRKStepMem step_mem_00;
  int local_4;
  
  tcur = 0.0;
  ycur = (N_Vector)0x0;
  local_4 = sprkStep_AccessStepMem
                      ((ARKodeMem)0x0,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (local_4 == 0) {
    p_Var1 = in_RDI->tempv1;
    p_Var2 = in_RDI->tempv2;
    step_mem_00 = (ARKodeSPRKStepMem)in_RDI->tempv3;
    N_VConst(0,p_Var1);
    for (iVar5 = 0; iVar5 < *(int *)(lRam0000000000000000 + 4); iVar5 = iVar5 + 1) {
      user_data = *(void **)(*(long *)(lRam0000000000000000 + 8) + (long)iVar5 * 8);
      dVar4 = *(double *)(*(long *)(lRam0000000000000000 + 0x10) + (long)iVar5 * 8);
      tcur = (double)user_data + tcur;
      ycur = (N_Vector)(dVar4 + (double)ycur);
      iRam0000000000000040 = iVar5;
      N_VLinearSum(0x3ff0000000000000,in_RDI->yn,p_Var1,p_Var2);
      N_VConst(0,uRam0000000000000010);
      iVar3 = sprkStep_f1(step_mem_00,tcur,ycur,(N_Vector)CONCAT44(iVar5,local_4),user_data);
      if (iVar3 != 0) {
        return -8;
      }
      N_VLinearSum(0x3ff0000000000000,in_RDI->h * dVar4,p_Var1,uRam0000000000000010,p_Var1);
      N_VLinearSum(0x3ff0000000000000,in_RDI->yn,p_Var1,p_Var2);
      in_RDI->tcur = (double)ycur * in_RDI->h + in_RDI->tn;
      N_VConst(0,uRam0000000000000010);
      local_4 = sprkStep_f2(step_mem_00,tcur,ycur,(N_Vector)CONCAT44(iVar5,iVar3),user_data);
      if (local_4 != 0) {
        return -8;
      }
      N_VLinearSum(0x3ff0000000000000,in_RDI->h * (double)user_data,p_Var1,uRam0000000000000010,
                   p_Var1);
      if (in_RDI->ProcessStage != (ARKPostProcessFn)0x0) {
        arkProcessError(in_RDI,-0x26,0x2a4,"sprkStep_TakeStep_Compensated",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                        ,"Compensated summation is not compatible with stage PostProcessing!\n");
        return -0x26;
      }
    }
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,p_Var1,uRam0000000000000018,p_Var1);
    N_VLinearSum(0x3ff0000000000000,in_RDI->yn,p_Var1,in_RDI->ycur);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,in_RDI->ycur,in_RDI->yn,step_mem_00);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,step_mem_00,p_Var1,uRam0000000000000018);
    *in_RDX = 0;
    *in_RSI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int sprkStep_TakeStep_Compensated(ARKodeMem ark_mem, sunrealtype* dsmPtr,
                                  int* nflagPtr)
{
  ARKodeSPRKStepMem step_mem = NULL;
  N_Vector delta_Yi          = NULL;
  N_Vector yn_plus_delta_Yi  = NULL;
  N_Vector diff              = NULL;
  sunrealtype ci             = SUN_RCONST(0.0);
  sunrealtype chati          = SUN_RCONST(0.0);
  int is                     = 0;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Vector shortcuts */
  delta_Yi         = ark_mem->tempv1;
  yn_plus_delta_Yi = ark_mem->tempv2;
  diff             = ark_mem->tempv3;

  /* [ \Delta P_0 ] = [ 0 ]
     [ \Delta Q_0 ] = [ 0 ] */
  N_VConst(ZERO, delta_Yi);

  /* loop over internal stages to the step */
  for (is = 0; is < step_mem->method->stages; is++)
  {
    /* load/compute coefficients */
    sunrealtype ai    = step_mem->method->a[is];
    sunrealtype ahati = step_mem->method->ahat[is];

    ci += ai;
    chati += ahati;

    /* store current stage index */
    step_mem->istage = is;

    /* [     ] + [            ]
       [ q_n ] + [ \Delta Q_i ] */
    N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, yn_plus_delta_Yi);

    /* Evaluate p' with the previous velocity */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f1(step_mem, ark_mem->tn + chati * ark_mem->h,
                         yn_plus_delta_Yi, step_mem->sdata, ark_mem->user_data);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* Incremental position update:
       [ \Delta P_i ] = [ \Delta P_{i-1} ] + [ sdata ]
       [            ] = [                ] + [       ] */
    N_VLinearSum(ONE, delta_Yi, ark_mem->h * ahati, step_mem->sdata, delta_Yi);

    /* [ p_n ] + [ \Delta P_i ]
       [     ] + [            ] */
    N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, yn_plus_delta_Yi);

    /* set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + chati * ark_mem->h;

    /* Evaluate q' with the current positions */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f2(step_mem, ark_mem->tn + ci * ark_mem->h,
                         yn_plus_delta_Yi, step_mem->sdata, ark_mem->user_data);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* Incremental velocity update:
       [            ] = [                ] + [       ]
       [ \Delta Q_i ] = [ \Delta Q_{i-1} ] + [ sdata ] */
    N_VLinearSum(ONE, delta_Yi, ark_mem->h * ai, step_mem->sdata, delta_Yi);

    /* if user-supplied stage postprocessing function, we error out since it
     * wont work with the increment form */
    if (ark_mem->ProcessStage != NULL)
    {
      arkProcessError(ark_mem, ARK_POSTPROCESS_STAGE_FAIL, __LINE__, __func__,
                      __FILE__,
                      "Compensated summation is not compatible with stage "
                      "PostProcessing!\n");
      return (ARK_POSTPROCESS_STAGE_FAIL);
    }
  }

  /*
    Now we compute the step solution via compensated summation.
     [ p_{n+1} ] = [ p_n ] + [ \Delta P_i ]
     [ q_{n+1} ] = [ q_n ] + [ \Delta Q_i ] */
  N_VLinearSum(ONE, delta_Yi, -ONE, step_mem->yerr, delta_Yi);
  N_VLinearSum(ONE, ark_mem->yn, ONE, delta_Yi, ark_mem->ycur);
  N_VLinearSum(ONE, ark_mem->ycur, -ONE, ark_mem->yn, diff);
  N_VLinearSum(ONE, diff, -ONE, delta_Yi, step_mem->yerr);

  *nflagPtr = 0;
  *dsmPtr   = SUN_RCONST(0.0);

  return 0;
}